

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::GetMouseDragDelta(int button,float lock_threshold)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  
  if ((uint)button < 5) {
    if (lock_threshold < 0.0) {
      lock_threshold = (GImGui->IO).MouseDragThreshold;
    }
    fVar3 = 0.0;
    fVar4 = 0.0;
    if (((GImGui->IO).MouseDown[(uint)button] == true) &&
       (lock_threshold * lock_threshold <= (GImGui->IO).MouseDragMaxDistanceSqr[(uint)button])) {
      IVar1 = (GImGui->IO).MousePos;
      IVar2 = (GImGui->IO).MouseClickedPos[(uint)button];
      fVar3 = IVar1.x - IVar2.x;
      fVar4 = IVar1.y - IVar2.y;
    }
    IVar1.y = fVar4;
    IVar1.x = fVar3;
    return IVar1;
  }
  __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x1291,"ImVec2 ImGui::GetMouseDragDelta(int, float)");
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(int button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            return g.IO.MousePos - g.IO.MouseClickedPos[button];     // Assume we can only get active with left-mouse button (at the moment).
    return ImVec2(0.0f, 0.0f);
}